

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

void __thiscall cmsys::Glob::~Glob(Glob *this)

{
  GlobInternals *this_00;
  
  this_00 = this->Internals;
  if (this_00 != (GlobInternals *)0x0) {
    GlobInternals::~GlobInternals(this_00);
  }
  operator_delete(this_00,0x30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->VisitedSymlinks);
  std::__cxx11::string::~string((string *)&this->Relative);
  return;
}

Assistant:

Glob::~Glob()
{
  delete this->Internals;
}